

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-base64.c
# Opt level: O0

void test_base64_encode_(TEST_VECTOR *vectors,BASE64_OPTIONS *options)

{
  char *__s;
  char *__s_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long in_RDI;
  int out_size;
  char *base64;
  char *blob;
  int i;
  char out_buf [256];
  char *local_168;
  bool local_149;
  bool local_135;
  int local_11c;
  char local_118 [32];
  BASE64_OPTIONS *in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff24;
  void *in_stack_ffffffffffffff28;
  
  local_11c = 0;
  while (*(long *)(in_RDI + (long)local_11c * 0x10) != 0) {
    __s = *(char **)(in_RDI + (long)local_11c * 0x10);
    __s_00 = *(char **)(in_RDI + (long)local_11c * 0x10 + 8);
    strlen(__s);
    uVar1 = base64_encode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                          in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                          in_stack_ffffffffffffff08);
    local_135 = false;
    if (-1 < (int)uVar1) {
      sVar4 = strlen(__s_00);
      local_135 = (long)(int)uVar1 == sVar4 + 1;
    }
    iVar2 = acutest_check_((int)(ulong)local_135,
                           "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-base64.c"
                           ,0x4a,"expected output size for \'%s\' -> \'%s\'",__s,__s_00);
    if (iVar2 == 0) {
      sVar4 = strlen(__s_00);
      acutest_message_("Expected: %d bytes",sVar4 & 0xffffffff);
      acutest_message_("Produced: %d bytes",(ulong)uVar1);
    }
    strlen(__s);
    iVar2 = base64_encode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                          in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                          in_stack_ffffffffffffff08);
    local_149 = false;
    if (-1 < iVar2) {
      sVar4 = strlen(__s_00);
      local_149 = false;
      if ((long)iVar2 == sVar4) {
        iVar3 = memcmp(local_118,__s_00,(long)iVar2);
        local_149 = iVar3 == 0;
      }
    }
    iVar3 = acutest_check_((int)(ulong)local_149,
                           "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-base64.c"
                           ,0x54,"encoding \'%s\' -> %s",__s,__s_00);
    if (iVar3 == 0) {
      acutest_message_("Expected: \'%s\'",__s_00);
      if (iVar2 < 1) {
        local_168 = "base64_encode() failed";
      }
      else {
        local_168 = local_118;
      }
      acutest_message_("Produced: \'%s\'",local_168);
    }
    local_11c = local_11c + 1;
  }
  return;
}

Assistant:

static void
test_base64_encode_(const TEST_VECTOR* vectors, const BASE64_OPTIONS* options)
{
    char out_buf[256];
    int i;

    for(i = 0; vectors[i].blob != NULL; i++) {
        const char* blob = vectors[i].blob;
        const char* base64 = vectors[i].base64;
        int out_size;

        out_size = base64_encode(blob, strlen(blob), NULL, 0, options);
        if(!TEST_CHECK_(out_size >= 0  &&
                        out_size == strlen(base64)+1,
                        "expected output size for '%s' -> '%s'", blob, base64))
        {
            TEST_MSG("Expected: %d bytes", (int) strlen(base64));
            TEST_MSG("Produced: %d bytes", (int) out_size);
        }

        out_size = base64_encode(blob, strlen(blob), out_buf, sizeof(out_buf), options);
        if(!TEST_CHECK_(out_size >= 0  &&
                        out_size == strlen(base64)  &&
                        memcmp(out_buf, base64, out_size) == 0,
                        "encoding '%s' -> %s", blob, base64))
        {
            TEST_MSG("Expected: '%s'", base64);
            TEST_MSG("Produced: '%s'", (out_size > 0 ? out_buf : "base64_encode() failed"));
        }
    }
}